

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

void R_BuildPlayerTranslation(int player)

{
  FPlayerSkin *pFVar1;
  int iVar2;
  FRemapTablePtr *pFVar3;
  FRemapTable *table;
  FRemapTable *alttable;
  FRemapTable *pillartable;
  FPlayerColorSet *local_20;
  FPlayerColorSet *colorset;
  float v;
  float s;
  float h;
  int player_local;
  
  s = (float)player;
  D_GetPlayerColor(player,&v,(float *)((long)&colorset + 4),(float *)&colorset,&local_20);
  pFVar1 = skins;
  iVar2 = userinfo_t::GetSkin((userinfo_t *)((long)(int)s * 0x2a0 + 0x1ae70f8));
  pFVar3 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                     (&translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>,(long)(int)s
                     );
  table = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar3);
  pFVar3 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                     (&translationtables[2].super_TArray<FRemapTablePtr,_FRemapTable_*>,(long)(int)s
                     );
  alttable = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar3);
  pFVar3 = TArray<FRemapTablePtr,_FRemapTable_*>::operator[]
                     (&translationtables[9].super_TArray<FRemapTablePtr,_FRemapTable_*>,(long)(int)s
                     );
  pillartable = FRemapTablePtr::operator_cast_to_FRemapTable_(pFVar3);
  R_CreatePlayerTranslation
            (v,colorset._4_4_,colorset._0_4_,local_20,pFVar1 + iVar2,table,alttable,pillartable);
  return;
}

Assistant:

void R_BuildPlayerTranslation (int player)
{
	float h, s, v;
	FPlayerColorSet *colorset;

	D_GetPlayerColor (player, &h, &s, &v, &colorset);

	R_CreatePlayerTranslation (h, s, v, colorset,
		&skins[players[player].userinfo.GetSkin()],
		translationtables[TRANSLATION_Players][player],
		translationtables[TRANSLATION_PlayersExtra][player],
		translationtables[TRANSLATION_RainPillar][player]
		);
}